

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall dxil_spv::CFGNode::post_dominates_perfect_structured_construct(CFGNode *this)

{
  bool bVar1;
  reference ppCVar2;
  CFGNode *p;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *this_local;
  
  bVar1 = post_dominates(this,this->immediate_dominator);
  if (bVar1) {
    __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(&this->pred);
    p = (CFGNode *)
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                  (&this->pred);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                       *)&p), bVar1) {
      ppCVar2 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end1);
      bVar1 = post_dominates(this,*ppCVar2);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CFGNode::post_dominates_perfect_structured_construct() const
{
	if (!post_dominates(immediate_dominator))
		return false;

	for (auto *p : pred)
		if (!post_dominates(p))
			return false;
	return true;
}